

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.cpp
# Opt level: O2

double gmlc::utilities::getTimeValue(string_view timeString,time_units defUnit)

{
  size_t *in_RCX;
  utilities *this;
  double dVar1;
  string_view unitString;
  basic_string_view<char,_std::char_traits<char>_> input;
  string_view sVar2;
  string_view trimCharacters;
  string_view timeString_local;
  size_t pos;
  
  sVar2._M_len = timeString._M_str;
  this = (utilities *)timeString._M_len;
  sVar2._M_str = (char *)&pos;
  timeString_local._M_len = (size_t)this;
  timeString_local._M_str = sVar2._M_len;
  dVar1 = strViewToFloat<double>(this,sVar2,in_RCX);
  if (pos < this) {
    input = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&timeString_local,pos,0xffffffffffffffff);
    trimCharacters._M_str = " \t\n\r";
    trimCharacters._M_len = 4;
    sVar2 = string_viewOps::trim(input,trimCharacters);
    unitString._M_str = sVar2._M_str;
    unitString._M_len = (size_t)unitString._M_str;
    defUnit = timeUnitsFromString((utilities *)sVar2._M_len,unitString);
  }
  return dVar1 * timeCountReverse[(int)defUnit];
}

Assistant:

double getTimeValue(std::string_view timeString, time_units defUnit)
{
    size_t pos;
    double val = numConvComp<double>(timeString, pos);
    if (pos >= timeString.size()) {
        return val * toSecondMultiplier(defUnit);
    }
    auto units = string_viewOps::trim(timeString.substr(pos));
    return val * toSecondMultiplier(timeUnitsFromString(units));
}